

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

void DumpTables(Float *frequencies,Float *expFrequencies,int thetaRes,int phiRes,char *filename)

{
  ostream *poVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  char *in_R8;
  int j_1;
  int i_1;
  int j;
  int i;
  ofstream f;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  ostream local_220 [520];
  int local_18;
  int local_14;
  long local_10;
  long local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::ofstream::ofstream(local_220,in_R8,_S_out);
  std::operator<<(local_220,"frequencies = [ ");
  for (local_230 = 0; local_230 < local_14; local_230 = local_230 + 1) {
    for (local_234 = 0; local_234 < local_18; local_234 = local_234 + 1) {
      std::ostream::operator<<
                (local_220,*(float *)(local_8 + (long)(local_230 * local_18 + local_234) * 4));
      if (local_234 + 1 < local_18) {
        std::operator<<(local_220,", ");
      }
    }
    if (local_230 + 1 < local_14) {
      std::operator<<(local_220,"; ");
    }
  }
  poVar1 = std::operator<<(local_220," ];");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar1,"expFrequencies = [ ");
  for (local_238 = 0; local_238 < local_14; local_238 = local_238 + 1) {
    for (local_23c = 0; local_23c < local_18; local_23c = local_23c + 1) {
      std::ostream::operator<<
                (local_220,*(float *)(local_10 + (long)(local_238 * local_18 + local_23c) * 4));
      if (local_23c + 1 < local_18) {
        std::operator<<(local_220,", ");
      }
    }
    if (local_238 + 1 < local_14) {
      std::operator<<(local_220,"; ");
    }
  }
  poVar1 = std::operator<<(local_220," ];");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"colormap(jet);");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"clf; subplot(2,1,1);");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"imagesc(frequencies);");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"title(\'Observed frequencies\');");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"axis equal;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"subplot(2,1,2);");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"imagesc(expFrequencies);");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"axis equal;");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"title(\'Expected frequencies\');");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void DumpTables(const Float* frequencies, const Float* expFrequencies, int thetaRes,
                int phiRes, const char* filename) {
    std::ofstream f(filename);

    f << "frequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << frequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl << "expFrequencies = [ ";
    for (int i = 0; i < thetaRes; ++i) {
        for (int j = 0; j < phiRes; ++j) {
            f << expFrequencies[i * phiRes + j];
            if (j + 1 < phiRes)
                f << ", ";
        }
        if (i + 1 < thetaRes)
            f << "; ";
    }
    f << " ];" << std::endl
      << "colormap(jet);" << std::endl
      << "clf; subplot(2,1,1);" << std::endl
      << "imagesc(frequencies);" << std::endl
      << "title('Observed frequencies');" << std::endl
      << "axis equal;" << std::endl
      << "subplot(2,1,2);" << std::endl
      << "imagesc(expFrequencies);" << std::endl
      << "axis equal;" << std::endl
      << "title('Expected frequencies');" << std::endl;
    f.close();
}